

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O0

err_t belsStdM(octet *m,size_t len,size_t num)

{
  bool_t bVar1;
  undefined1 *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  undefined7 in_stack_ffffffffffffffd8;
  octet in_stack_ffffffffffffffdf;
  err_t local_4;
  
  if ((((in_RSI == 0x10) || (in_RSI == 0x18)) || (in_RSI == 0x20)) &&
     ((bVar1 = memIsValid(in_RDI,in_RSI), bVar1 != 0 && (in_RDX <= &DAT_00000010)))) {
    if (in_RSI == 0x10) {
      u32To(in_RDX,CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),(u32 *)0x13171e);
    }
    else if (in_RSI == 0x18) {
      u32To(in_RDX,CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),(u32 *)0x13174a);
    }
    else {
      u32To(in_RDX,CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),(u32 *)0x13176e);
    }
    memSet(in_RDX,in_stack_ffffffffffffffdf,0x131789);
    local_4 = 0;
  }
  else {
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

err_t belsStdM(octet m[], size_t len, size_t num)
{
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || 
		!memIsValid(m, len) || num > 16)
		return ERR_BAD_INPUT;
	// загрузить
	if (len == 16)
		u32To(m, 4, m_16 + num);
	else if (len == 24)
		u32To(m, 4, m_24 + num);
	else
		u32To(m, 4, m_32 + num);
	memSetZero(m + 4, len - 4);
	return ERR_OK;
}